

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
duckdb::ArrowVarint::GetType(ArrowSchema *schema,ArrowSchemaMetadata *schema_metadata)

{
  bool bVar1;
  InvalidInputException *this;
  allocator local_59;
  string local_58;
  string format;
  
  ::std::__cxx11::string::string
            ((string *)&format,(char *)(schema_metadata->schema_metadata_map)._M_h._M_buckets,
             (allocator *)&local_58);
  bVar1 = ::std::operator==(&format,"z");
  if (bVar1) {
    local_59 = (allocator)0x0;
    make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
              ((duckdb *)&local_58,(ArrowVariableSizeType *)&local_59);
    make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
              ((duckdb *)schema,&LogicalType::VARINT,
               (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                *)&local_58);
  }
  else {
    bVar1 = ::std::operator==(&format,"Z");
    if (!bVar1) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"Arrow extension type \"%s\" not supported for Varint",
                 &local_59);
      InvalidInputException::InvalidInputException<char_const*>
                (this,&local_58,format._M_dataplus._M_p);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_59 = (allocator)0x2;
    make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
              ((duckdb *)&local_58,(ArrowVariableSizeType *)&local_59);
    make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
              ((duckdb *)schema,&LogicalType::VARINT,
               (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                *)&local_58);
  }
  if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
  }
  ::std::__cxx11::string::~string((string *)&format);
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)schema;
}

Assistant:

static unique_ptr<ArrowType> GetType(const ArrowSchema &schema, const ArrowSchemaMetadata &schema_metadata) {
		const auto format = string(schema.format);
		if (format == "z") {
			return make_uniq<ArrowType>(LogicalType::VARINT, make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL));
		} else if (format == "Z") {
			return make_uniq<ArrowType>(LogicalType::VARINT,
			                            make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE));
		}
		throw InvalidInputException("Arrow extension type \"%s\" not supported for Varint", format.c_str());
	}